

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_strncat_l(archive_string *as,void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  long lVar4;
  archive_string *paVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t s;
  bool bVar9;
  
  if (n != 0 && _p != (void *)0x0) {
    if ((sc == (archive_string_conv *)0x0) || ((sc->flag & L'⠀') == L'\0')) {
      sVar6 = 0;
      do {
        s = sVar6;
        if (*(char *)((long)_p + sVar6) == '\0') break;
        sVar6 = sVar6 + 1;
        s = n;
      } while (n != sVar6);
      goto LAB_004717ec;
    }
    if (1 < n) {
      uVar7 = 0;
      do {
        if ((*(char *)((long)_p + uVar7 * 2) == '\0') &&
           (uVar8 = uVar7, *(char *)((long)_p + uVar7 * 2 + 1) == '\0')) break;
        uVar7 = uVar7 + 1;
        uVar8 = n >> 1;
      } while (n >> 1 != uVar7);
      s = uVar8 * 2;
      goto LAB_004717ec;
    }
  }
  s = 0;
LAB_004717ec:
  if (s == 0) {
    if (sc == (archive_string_conv *)0x0) {
      lVar4 = 1;
      bVar9 = false;
    }
    else {
      bVar9 = (sc->flag & L'᐀') != L'\0';
      lVar4 = (ulong)bVar9 + 1;
    }
    paVar5 = archive_string_ensure(as,lVar4 + as->length);
    if (paVar5 == (archive_string *)0x0) {
      wVar2 = L'\xffffffff';
    }
    else {
      as->s[as->length] = '\0';
      wVar2 = L'\0';
      if (bVar9) {
        as->s[as->length + 1] = '\0';
        wVar2 = L'\0';
      }
    }
  }
  else if (sc == (archive_string_conv *)0x0) {
    paVar5 = archive_string_append(as,(char *)_p,s);
    wVar2 = -(uint)(paVar5 == (archive_string *)0x0);
  }
  else {
    if (sc->nconverter < L'\x02') {
      lVar4 = 0;
      wVar1 = L'\0';
    }
    else {
      (sc->utftmp).length = 0;
      wVar1 = (*sc->converter[0])(&sc->utftmp,_p,s,sc);
      if ((wVar1 != L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        return wVar1;
      }
      wVar1 = wVar1 >> 0x1f & wVar1;
      _p = (sc->utftmp).s;
      s = (sc->utftmp).length;
      lVar4 = 1;
    }
    wVar2 = (*sc->converter[lVar4])(as,_p,s,sc);
    if (wVar1 < wVar2) {
      wVar2 = wVar1;
    }
  }
  return wVar2;
}

Assistant:

int
archive_strncat_l(struct archive_string *as, const void *_p, size_t n,
    struct archive_string_conv *sc)
{
	const void *s;
	size_t length = 0;
	int i, r = 0, r2;

	if (_p != NULL && n > 0) {
		if (sc != NULL && (sc->flag & SCONV_FROM_UTF16))
			length = utf16nbytes(_p, n);
		else
			length = mbsnbytes(_p, n);
	}

	/* We must allocate memory even if there is no data for conversion
	 * or copy. This simulates archive_string_append behavior. */
	if (length == 0) {
		int tn = 1;
		if (sc != NULL && (sc->flag & SCONV_TO_UTF16))
			tn = 2;
		if (archive_string_ensure(as, as->length + tn) == NULL)
			return (-1);
		as->s[as->length] = 0;
		if (tn == 2)
			as->s[as->length+1] = 0;
		return (0);
	}

	/*
	 * If sc is NULL, we just make a copy.
	 */
	if (sc == NULL) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (0);
	}

	s = _p;
	i = 0;
	if (sc->nconverter > 1) {
		sc->utftmp.length = 0;
		r2 = sc->converter[0](&(sc->utftmp), s, length, sc);
		if (r2 != 0 && errno == ENOMEM)
			return (r2);
		if (r > r2)
			r = r2;
		s = sc->utftmp.s;
		length = sc->utftmp.length;
		++i;
	}
	r2 = sc->converter[i](as, s, length, sc);
	if (r > r2)
		r = r2;
	return (r);
}